

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx::DiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  undefined1 auVar11 [32];
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar20;
  float fVar21;
  undefined1 auVar17 [16];
  float fVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_1d8 [16];
  Scene *local_1c0;
  RayQueryContext *local_1b8;
  Primitive *local_1b0;
  RTCFilterFunctionNArguments local_1a8;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  RTCHitN local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  undefined1 auVar48 [64];
  
  local_1c0 = context->scene;
  pGVar6 = (local_1c0->geometries).items[Disc->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar14 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar19 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar34 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar27 = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar15 = vunpcklps_avx(auVar14,auVar34);
  auVar18 = vunpckhps_avx(auVar14,auVar34);
  auVar14 = vunpcklps_avx(auVar19,auVar27);
  auVar39 = vunpckhps_avx(auVar19,auVar27);
  auVar27 = vunpcklps_avx(auVar15,auVar14);
  auVar19 = vunpckhps_avx(auVar15,auVar14);
  auVar35 = vunpcklps_avx(auVar18,auVar39);
  auVar14 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar34 = vpcmpgtd_avx(auVar14,_DAT_01f7fcf0);
  local_158 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar27 = vsubps_avx(auVar27,auVar17);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15 = vsubps_avx(auVar19,auVar15);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar35 = vsubps_avx(auVar35,auVar14);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar14 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar19 = vshufps_avx(auVar14,auVar14,0);
  auVar14 = vrcpps_avx(auVar19);
  fVar38 = auVar14._0_4_;
  auVar32._0_4_ = fVar38 * auVar19._0_4_;
  fVar41 = auVar14._4_4_;
  auVar32._4_4_ = fVar41 * auVar19._4_4_;
  fVar42 = auVar14._8_4_;
  auVar32._8_4_ = fVar42 * auVar19._8_4_;
  fVar43 = auVar14._12_4_;
  auVar32._12_4_ = fVar43 * auVar19._12_4_;
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar44,auVar32);
  fVar28 = auVar35._0_4_;
  fVar29 = auVar35._4_4_;
  fVar30 = auVar35._8_4_;
  fVar31 = auVar35._12_4_;
  fVar23 = auVar15._0_4_;
  fVar24 = auVar15._4_4_;
  fVar25 = auVar15._8_4_;
  fVar26 = auVar15._12_4_;
  fVar16 = auVar27._0_4_;
  fVar20 = auVar27._4_4_;
  fVar21 = auVar27._8_4_;
  fVar22 = auVar27._12_4_;
  local_128._0_4_ =
       (fVar16 * fVar2 + fVar23 * fVar3 + fVar28 * fVar4) * (fVar38 + fVar38 * auVar14._0_4_);
  local_128._4_4_ =
       (fVar20 * fVar2 + fVar24 * fVar3 + fVar29 * fVar4) * (fVar41 + fVar41 * auVar14._4_4_);
  local_128._8_4_ =
       (fVar21 * fVar2 + fVar25 * fVar3 + fVar30 * fVar4) * (fVar42 + fVar42 * auVar14._8_4_);
  local_128._12_4_ =
       (fVar22 * fVar2 + fVar26 * fVar3 + fVar31 * fVar4) * (fVar43 + fVar43 * auVar14._12_4_);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar14 = vcmpps_avx(auVar19,local_128,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar48 = ZEXT1664(auVar47);
  auVar19 = vcmpps_avx(local_128,auVar47,2);
  auVar14 = vandps_avx(auVar19,auVar14);
  auVar19 = auVar34 & auVar14;
  if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0') {
    auVar14 = vandps_avx(auVar14,auVar34);
    auVar18 = vunpckhps_avx(auVar18,auVar39);
    auVar34._0_4_ = fVar2 * local_128._0_4_;
    auVar34._4_4_ = fVar2 * local_128._4_4_;
    auVar34._8_4_ = fVar2 * local_128._8_4_;
    auVar34._12_4_ = fVar2 * local_128._12_4_;
    auVar39._0_4_ = fVar3 * local_128._0_4_;
    auVar39._4_4_ = fVar3 * local_128._4_4_;
    auVar39._8_4_ = fVar3 * local_128._8_4_;
    auVar39._12_4_ = fVar3 * local_128._12_4_;
    auVar45._0_4_ = fVar4 * local_128._0_4_;
    auVar45._4_4_ = fVar4 * local_128._4_4_;
    auVar45._8_4_ = fVar4 * local_128._8_4_;
    auVar45._12_4_ = fVar4 * local_128._12_4_;
    auVar19 = vsubps_avx(auVar27,auVar34);
    auVar34 = vsubps_avx(auVar15,auVar39);
    auVar27 = vsubps_avx(auVar35,auVar45);
    auVar35._0_4_ =
         auVar19._0_4_ * auVar19._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar27._0_4_ * auVar27._0_4_;
    auVar35._4_4_ =
         auVar19._4_4_ * auVar19._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar27._4_4_ * auVar27._4_4_;
    auVar35._8_4_ =
         auVar19._8_4_ * auVar19._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar27._8_4_ * auVar27._8_4_;
    auVar35._12_4_ =
         auVar19._12_4_ * auVar19._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar27._12_4_ * auVar27._12_4_;
    auVar27._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar27._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar27._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar27._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar19 = vcmpps_avx(auVar35,auVar27,2);
    auVar34 = auVar14 & auVar19;
    if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0')
    {
      auVar19 = vandps_avx(auVar19,auVar14);
      auVar18._0_4_ = fVar16 * fVar16 + fVar23 * fVar23 + fVar28 * fVar28;
      auVar18._4_4_ = fVar20 * fVar20 + fVar24 * fVar24 + fVar29 * fVar29;
      auVar18._8_4_ = fVar21 * fVar21 + fVar25 * fVar25 + fVar30 * fVar30;
      auVar18._12_4_ = fVar22 * fVar22 + fVar26 * fVar26 + fVar31 * fVar31;
      auVar34 = vcmpps_avx(auVar18,auVar27,6);
      auVar19 = vandps_avx(auVar19,auVar34);
      iVar12 = vmovmskps_avx(auVar19);
      if (iVar12 != 0) {
        local_108._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_108._8_4_ = -fVar3;
        local_108._12_4_ = -fVar3;
        local_f8._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_f8._8_4_ = -fVar4;
        local_f8._12_4_ = -fVar4;
        auVar19 = ZEXT816(0);
        local_148 = ZEXT1632(auVar19);
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        uVar13 = (ulong)(byte)iVar12;
        auVar11 = vcmpps_avx(ZEXT1632(auVar19),ZEXT1632(auVar19),0xf);
        auVar33 = ZEXT3264(auVar11);
        auVar36 = ZEXT864(0) << 0x20;
        auVar14 = vpcmpeqd_avx(auVar14,auVar14);
        auVar37 = ZEXT1664(auVar14);
        auVar40 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_1b0 = Disc;
        local_1b8 = context;
        do {
          local_1a8.hit = local_e8;
          uVar10 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar5 = *(uint *)(local_158 + uVar10 * 4);
          pGVar6 = (local_1c0->geometries).items[uVar5].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((local_1b8->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar1 = *(undefined4 *)(local_148 + uVar10 * 4);
            local_b8._4_4_ = uVar1;
            local_b8._0_4_ = uVar1;
            local_b8._8_4_ = uVar1;
            local_b8._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_148 + uVar10 * 4 + 0x10);
            local_a8._4_4_ = uVar1;
            local_a8._0_4_ = uVar1;
            local_a8._8_4_ = uVar1;
            local_a8._12_4_ = uVar1;
            *(float *)(ray + k * 4 + 0x80) = local_118[uVar10 - 4];
            local_1a8.context = local_1b8->user;
            local_88 = vpshufd_avx(ZEXT416(uVar5),0);
            uVar5 = (local_1b0->primIDs).field_0.i[uVar10];
            local_98._4_4_ = uVar5;
            local_98._0_4_ = uVar5;
            local_98._8_4_ = uVar5;
            local_98._12_4_ = uVar5;
            fVar2 = local_118[uVar10];
            uVar1 = *(undefined4 *)(local_108 + uVar10 * 4);
            local_d8._4_4_ = uVar1;
            local_d8._0_4_ = uVar1;
            local_d8._8_4_ = uVar1;
            local_d8._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_f8 + uVar10 * 4);
            local_c8._4_4_ = uVar1;
            local_c8._0_4_ = uVar1;
            local_c8._8_4_ = uVar1;
            local_c8._12_4_ = uVar1;
            local_e8[0] = (RTCHitN)SUB41(fVar2,0);
            local_e8[1] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[2] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[3] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[4] = (RTCHitN)SUB41(fVar2,0);
            local_e8[5] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[6] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[7] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[8] = (RTCHitN)SUB41(fVar2,0);
            local_e8[9] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[10] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[0xb] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[0xc] = (RTCHitN)SUB41(fVar2,0);
            local_e8[0xd] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[0xe] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[0xf] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            uStack_74 = (local_1a8.context)->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = (local_1a8.context)->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            local_1d8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            local_1a8.geometryUserPtr = pGVar6->userPtr;
            local_1a8.N = 4;
            local_168 = auVar48._0_16_;
            local_58 = auVar33._0_32_;
            local_178 = auVar40._0_16_;
            local_1a8.valid = (int *)local_1d8;
            local_1a8.ray = (RTCRayN *)ray;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar14 = auVar37._0_16_;
              local_1a8.valid = (int *)local_1d8;
              (*pGVar6->occlusionFilterN)(&local_1a8);
              auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar40 = ZEXT1664(local_178);
              auVar14 = vpcmpeqd_avx(auVar14,auVar14);
              auVar37 = ZEXT1664(auVar14);
              auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar33 = ZEXT3264(local_58);
              auVar48 = ZEXT1664(local_168);
            }
            auVar14 = auVar37._0_16_;
            if (local_1d8 == (undefined1  [16])0x0) {
              auVar19 = vpcmpeqd_avx(auVar36._0_16_,(undefined1  [16])0x0);
              auVar14 = auVar14 ^ auVar19;
            }
            else {
              p_Var9 = local_1b8->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((local_1b8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var9)(&local_1a8);
                auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar40 = ZEXT1664(local_178);
                auVar14 = vpcmpeqd_avx(auVar14,auVar14);
                auVar37 = ZEXT1664(auVar14);
                auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar33 = ZEXT3264(local_58);
                auVar48 = ZEXT1664(local_168);
              }
              auVar19 = vpcmpeqd_avx(auVar36._0_16_,local_1d8);
              auVar14 = auVar37._0_16_ ^ auVar19;
              auVar19 = vblendvps_avx(auVar46._0_16_,*(undefined1 (*) [16])(local_1a8.ray + 0x80),
                                      auVar19);
              *(undefined1 (*) [16])(local_1a8.ray + 0x80) = auVar19;
            }
            if ((auVar40._0_16_ & auVar14) != (undefined1  [16])0x0) {
              return true;
            }
            *(int *)(ray + k * 4 + 0x80) = auVar48._0_4_;
          }
          uVar13 = uVar13 ^ 1L << (uVar10 & 0x3f);
        } while (uVar13 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }